

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis256.cc
# Opt level: O3

int aead_aegis_256_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int line;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  aes_block_t tmp;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  uint8_t src [16];
  aes_block_t local_180;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [6] [16];
  
  if (nonce_len < 0x21) {
    if (ctx->tag_len == in_tag_len) {
      aegis_256_state_init((ctx->state).opaque,nonce,nonce_len,&local_180);
      auVar26 = ZEXT1664((undefined1  [16])local_180);
      if (ad_len < 0x10) {
        lVar3 = 0;
      }
      else {
        auVar11 = ZEXT1664(local_170);
        auVar9 = ZEXT1664(local_160);
        auVar6 = ZEXT1664(local_150);
        auVar14 = ZEXT1664(local_140);
        auVar18 = ZEXT1664(local_130);
        lVar2 = 0;
        do {
          auVar5 = aesenc(auVar18._0_16_,auVar26._0_16_);
          local_130 = aesenc(auVar14._0_16_,auVar18._0_16_);
          auVar18._0_32_ = ZEXT1632(local_130);
          local_140 = aesenc(auVar6._0_16_,auVar14._0_16_);
          auVar14._0_32_ = ZEXT1632(local_140);
          local_150 = aesenc(auVar9._0_16_,auVar6._0_16_);
          auVar6._0_32_ = ZEXT1632(local_150);
          local_160 = aesenc(auVar11._0_16_,auVar9._0_16_);
          auVar9._0_32_ = ZEXT1632(local_160);
          local_170 = aesenc(auVar26._0_16_,auVar11._0_16_);
          auVar11._0_32_ = ZEXT1632(local_170);
          auVar26 = ZEXT1664(auVar5 ^ *(undefined1 (*) [16])(ad + lVar2));
          lVar3 = lVar2 + 0x10;
          uVar4 = lVar2 + 0x20;
          lVar2 = lVar3;
        } while (uVar4 <= ad_len);
      }
      if ((ad_len & 0xf) != 0) {
        local_90[0] = (undefined1  [16])0x0;
        local_120 = auVar26._0_16_;
        memcpy(local_90,ad + lVar3,ad_len & 0xf);
        auVar21 = aesenc(local_140,local_130);
        local_140 = aesenc(local_150,local_140);
        local_150 = aesenc(local_160,local_150);
        local_160 = aesenc(local_170,local_160);
        local_170 = aesenc(local_120,local_170);
        auVar5 = aesenc(local_130,local_120);
        auVar26 = ZEXT1664(auVar5 ^ local_90[0]);
        local_130 = auVar21;
      }
      if (in_len < 0x10) {
        lVar3 = 0;
      }
      else {
        auVar12 = ZEXT1664(local_170);
        auVar10 = ZEXT1664(local_160);
        auVar7 = ZEXT1664(local_150);
        auVar15 = ZEXT1664(local_140);
        auVar19 = ZEXT1664(local_130);
        lVar2 = 0;
        do {
          auVar21 = auVar7._0_16_;
          auVar8 = auVar10._0_16_;
          auVar5 = vpand_avx(auVar8,auVar21);
          auVar17 = auVar15._0_16_;
          auVar22 = auVar19._0_16_;
          auVar13 = auVar12._0_16_;
          auVar5 = auVar5 ^ *(undefined1 (*) [16])(in + lVar2) ^ auVar22 ^ auVar17 ^ auVar13;
          *(undefined1 (*) [16])(out + lVar2) = auVar5;
          auVar24 = aesenc(auVar22,auVar26._0_16_);
          local_130 = aesenc(auVar17,auVar22);
          auVar19._0_32_ = ZEXT1632(local_130);
          local_140 = aesenc(auVar21,auVar17);
          auVar15._0_32_ = ZEXT1632(local_140);
          local_150 = aesenc(auVar8,auVar21);
          auVar7._0_32_ = ZEXT1632(local_150);
          local_160 = aesenc(auVar13,auVar8);
          auVar10._0_32_ = ZEXT1632(local_160);
          local_170 = aesenc(auVar26._0_16_,auVar13);
          auVar12._0_32_ = ZEXT1632(local_170);
          auVar26 = ZEXT1664(auVar24 ^ auVar5);
          lVar3 = lVar2 + 0x10;
          uVar4 = lVar2 + 0x20;
          lVar2 = lVar3;
        } while (uVar4 <= in_len);
      }
      uVar4 = in_len & 0xf;
      auVar5 = local_170;
      auVar21 = local_150;
      auVar8 = local_160;
      auVar13 = local_140;
      auVar17 = local_130;
      if (uVar4 != 0) {
        local_a0 = (undefined1  [16])0x0;
        local_120 = auVar26._0_16_;
        memcpy(local_a0,in + lVar3,uVar4);
        auVar5 = vpand_avx(local_150,local_160);
        local_c0 = auVar5 ^ local_a0 ^ local_170 ^ local_140 ^ local_130;
        local_d0 = aesenc(local_140,local_130);
        local_e0 = aesenc(local_150,local_140);
        local_f0 = aesenc(local_160,local_150);
        local_100 = aesenc(local_170,local_160);
        local_110 = aesenc(local_120,local_170);
        local_120 = aesenc(local_130,local_120);
        local_a0 = local_c0;
        memcpy(out + lVar3,local_a0,uVar4);
        memset(local_a0,0,uVar4);
        auVar26 = ZEXT1664(local_120 ^ local_a0 ^ local_c0);
        auVar5 = local_110;
        auVar21 = local_f0;
        auVar8 = local_100;
        auVar13 = local_e0;
        auVar17 = local_d0;
      }
      auVar28 = ZEXT1664(auVar17);
      auVar25 = ZEXT1664(auVar13);
      auVar23 = ZEXT1664(auVar8);
      auVar20 = ZEXT1664(auVar21);
      auVar16 = ZEXT1664(auVar5);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = in_len;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = ad_len;
      auVar5 = vpunpcklqdq_avx(auVar21,auVar5);
      auVar5 = vpsllq_avx(auVar5,3);
      iVar1 = 7;
      do {
        auVar21 = aesenc(auVar28._0_16_,auVar26._0_16_);
        auVar27 = aesenc(auVar25._0_16_,auVar28._0_16_);
        auVar28._0_32_ = ZEXT1632(auVar27);
        auVar24 = aesenc(auVar20._0_16_,auVar25._0_16_);
        auVar25._0_32_ = ZEXT1632(auVar24);
        auVar17 = aesenc(auVar23._0_16_,auVar20._0_16_);
        auVar20._0_32_ = ZEXT1632(auVar17);
        auVar22 = aesenc(auVar16._0_16_,auVar23._0_16_);
        auVar23._0_32_ = ZEXT1632(auVar22);
        auVar13 = aesenc(auVar26._0_16_,auVar16._0_16_);
        auVar16._0_32_ = ZEXT1632(auVar13);
        auVar21 = auVar5 ^ auVar8 ^ auVar21;
        auVar26 = ZEXT1664(auVar21);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      local_b0 = auVar27 ^ auVar24 ^ auVar17 ^ auVar22 ^ auVar13 ^ auVar21;
      iVar1 = CRYPTO_memcmp(local_b0,in_tag,in_tag_len);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = 0x65;
      line = 0x15a;
    }
    else {
      iVar1 = 0x65;
      line = 0x13a;
    }
  }
  else {
    iVar1 = 0x79;
    line = 0x136;
  }
  ERR_put_error(0x1e,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_256_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                      const uint8_t *nonce, size_t nonce_len,
                                      const uint8_t *in, size_t in_len,
                                      const uint8_t *in_tag, size_t in_tag_len,
                                      const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_256_ctx *aegis_ctx =
      (struct aead_aegis_256_ctx *)&ctx->state;

  return aegis_256_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                               in_len, in_tag, in_tag_len, ad, ad_len,
                               ctx->tag_len);
}